

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

void Llb_NonlinReorder(DdManager *dd,int fTwice,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  int level;
  DdManager *pDVar5;
  
  aVar3 = Abc_Clock();
  if (fVerbose == 0) {
    Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
    if (fTwice == 0) {
      return;
    }
  }
  else {
    uVar1 = Cudd_ReadKeys(dd);
    pDVar5 = dd;
    uVar2 = Cudd_ReadDead(dd);
    Abc_Print((int)pDVar5,"Reordering... Before =%5d. ",(ulong)(uVar1 - uVar2));
    Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
    uVar1 = Cudd_ReadKeys(dd);
    pDVar5 = dd;
    uVar2 = Cudd_ReadDead(dd);
    level = (int)pDVar5;
    Abc_Print(level,"After =%5d. ",(ulong)(uVar1 - uVar2));
    if (fTwice == 0) goto LAB_0075d55e;
  }
  Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
  if (fVerbose == 0) {
    return;
  }
  uVar1 = Cudd_ReadKeys(dd);
  uVar2 = Cudd_ReadDead(dd);
  level = (int)dd;
  Abc_Print(level,"After =%5d. ",(ulong)(uVar1 - uVar2));
LAB_0075d55e:
  aVar4 = Abc_Clock();
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
  return;
}

Assistant:

void Llb_NonlinReorder( DdManager * dd, int fTwice, int fVerbose )
{
    abctime clk = Abc_Clock();
    if ( fVerbose )
        Abc_Print( 1, "Reordering... Before =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
    if ( fVerbose )
        Abc_Print( 1, "After =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    if ( fTwice )
    {
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        if ( fVerbose )
            Abc_Print( 1, "After =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    }
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}